

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O2

void __thiscall
db_unpacker::extract_1114(db_unpacker *this,string *prefix,string *mask,xr_reader *s,uint8_t *data)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t *puVar3;
  bool bVar4;
  xr_file_system *this_00;
  long lVar5;
  string *path_00;
  ulong uVar6;
  uint8_t *p;
  size_t real_size;
  string folder;
  string temp;
  string path;
  uint8_t *local_a8;
  string *local_a0;
  size_t local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_a0 = prefix;
  this_00 = xray_re::xr_file_system::instance();
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50.field_2._M_local_buf[0] = '\0';
  local_90.field_2._M_local_buf[0] = '\0';
LAB_0011edef:
  bVar4 = xray_re::xr_reader::eof(s);
  if (bVar4) {
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    return;
  }
  xray_re::xr_reader::r_sz(s,&local_70);
  puVar3 = (s->field_2).m_p_u32;
  (s->field_2).m_p = (uint8_t *)(puVar3 + 1);
  uVar1 = *puVar3;
  (s->field_2).m_p = (uint8_t *)(puVar3 + 2);
  uVar6 = (ulong)puVar3[1];
  (s->field_2).m_p = (uint8_t *)(puVar3 + 3);
  uVar2 = puVar3[2];
  if ((uVar6 != 0) && (mask->_M_string_length != 0)) goto code_r0x0011ee3e;
  goto LAB_0011ee51;
code_r0x0011ee3e:
  lVar5 = std::__cxx11::string::find((string *)&local_50,(ulong)mask);
  if (lVar5 != -1) {
LAB_0011ee51:
    std::__cxx11::string::_M_assign((string *)&local_50);
    path_00 = (string *)std::__cxx11::string::append((string *)&local_50);
    xray_re::xr_file_system::split_path(path_00,&local_90,(string *)0x0,(string *)0x0);
    bVar4 = xray_re::xr_file_system::folder_exist(local_90._M_dataplus._M_p);
    if (!bVar4) {
      xray_re::xr_file_system::create_path(this_00,local_90._M_dataplus._M_p);
    }
    if (uVar1 == 0) {
      xray_re::xr_lzhuf::decompress(&local_a8,&local_98,data + uVar6,(ulong)uVar2);
      if (local_98 != 0) {
        write_file(this_00,&local_50,local_a8,local_98);
      }
      free(local_a8);
    }
    else {
      write_file(this_00,&local_50,data + uVar6,(ulong)uVar2);
    }
  }
  goto LAB_0011edef;
}

Assistant:

void db_unpacker::extract_1114(const std::string& prefix, const std::string& mask, xr_reader* s, const uint8_t* data) const
{
	xr_file_system& fs = xr_file_system::instance();
	for (std::string temp, path, folder; !s->eof(); ) {
		s->r_sz(temp);
		unsigned uncompressed = s->r_u32();
		unsigned offset = s->r_u32();
		unsigned size = s->r_u32();

		if (mask.length() && (offset != 0))
		//if (path.compare(path.size()-mask.size(),mask.size(),mask) != 0)
		if (path.find(mask) == -1)
		continue;

		if (DB_DEBUG && fs.read_only()) {
			msg("%s", temp.c_str());
			msg("  offset: %u", offset);
			if (uncompressed)
				msg("  size (real): %u", size);
			else
				msg("  size (compressed): %u", size);
		} else {
			path = prefix;
			fs.split_path(path.append(temp), &folder);
			if (!fs.folder_exist(folder))
				fs.create_path(folder);
			if (uncompressed) {
				write_file(fs, path, data + offset, size);
			} else {
				size_t real_size;
				uint8_t* p;
				xr_lzhuf::decompress(p, real_size, data + offset, size);
				if (real_size)
					write_file(fs, path, p, real_size);
				free(p);
			}
		}
	}
}